

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_f5df0e::DirectoryObject::DumpInstaller
          (Value *__return_storage_ptr__,DirectoryObject *this,cmInstallGenerator *gen)

{
  undefined8 *puVar1;
  long *plVar2;
  string *psVar3;
  cmFileSet *pcVar4;
  bool bVar5;
  JBTIndex value;
  long lVar6;
  cmInstallDirectoryGenerator *pcVar7;
  Value *pVVar8;
  mapped_type *pmVar9;
  cmInstallFilesGenerator *this_00;
  cmInstallScriptGenerator *this_01;
  cmInstallImportedRuntimeArtifactsGenerator *this_02;
  cmInstallRuntimeDependencySetGenerator *this_03;
  cmInstallFileSetGenerator *this_04;
  cmLocalGenerator *lg;
  cmLocalGenerator *lg_00;
  cmInstallCxxModuleBmiGenerator *this_05;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entryCge;
  long *plVar10;
  string *psVar11;
  string *in_R8;
  _Alloc_hider filename;
  ulong uVar12;
  string_view str;
  string name;
  cmGeneratorTarget *target_1;
  char *local_1f0;
  Value paths_1;
  string local_198 [32];
  string local_178 [32];
  NamelinkModeType local_158;
  cmGeneratorTarget *target;
  cmInstallDirectoryGenerator *local_140;
  cmFileSet *local_138;
  string fromDir;
  string toDir;
  Value paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  entryCges;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [2];
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  string local_50;
  
  if (gen == (cmInstallGenerator *)0x0) {
    __assert_fail("gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileAPICodemodel.cxx"
                  ,0x373,
                  "Json::Value (anonymous namespace)::DirectoryObject::DumpInstaller(cmInstallGenerator *)"
                 );
  }
  Json::Value::Value(__return_storage_ptr__,objectValue);
  lVar6 = __dynamic_cast(gen,&cmInstallGenerator::typeinfo,&cmInstallSubdirectoryGenerator::typeinfo
                         ,0);
  if (lVar6 != 0) {
    return __return_storage_ptr__;
  }
  lVar6 = __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                         &cmInstallGetRuntimeDependenciesGenerator::typeinfo,0);
  if (lVar6 != 0) {
    return __return_storage_ptr__;
  }
  bVar5 = cmInstallGenerator::InstallsForConfig(gen,this->Config);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar7 = (cmInstallDirectoryGenerator *)
           __dynamic_cast(gen,&cmInstallGenerator::typeinfo,&cmInstallTargetGenerator::typeinfo,0);
  if (pcVar7 == (cmInstallDirectoryGenerator *)0x0) {
    this_00 = (cmInstallFilesGenerator *)
              __dynamic_cast(gen,&cmInstallGenerator::typeinfo,&cmInstallFilesGenerator::typeinfo,0)
    ;
    if (this_00 == (cmInstallFilesGenerator *)0x0) {
      pcVar7 = (cmInstallDirectoryGenerator *)
               __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                              &cmInstallDirectoryGenerator::typeinfo,0);
      if (pcVar7 == (cmInstallDirectoryGenerator *)0x0) {
        lVar6 = __dynamic_cast(gen,&cmInstallGenerator::typeinfo,&cmInstallExportGenerator::typeinfo
                               ,0);
        if (lVar6 != 0) {
          Json::Value::Value(&paths_1,"export");
          pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
          Json::Value::operator=(pVVar8,&paths_1);
          Json::Value::~Value(&paths_1);
          Json::Value::Value(&paths_1,(String *)(lVar6 + 0x70));
          pVVar8 = Json::Value::operator[](__return_storage_ptr__,"destination");
          Json::Value::operator=(pVVar8,&paths_1);
          Json::Value::~Value(&paths_1);
          puVar1 = *(undefined8 **)(lVar6 + 200);
          Json::Value::Value(&paths_1,(String *)(puVar1 + 3));
          pVVar8 = Json::Value::operator[](__return_storage_ptr__,"exportName");
          Json::Value::operator=(pVVar8,&paths_1);
          Json::Value::~Value(&paths_1);
          Json::Value::Value((Value *)&target_1,arrayValue);
          plVar2 = (long *)puVar1[1];
          for (plVar10 = (long *)*puVar1; plVar10 != plVar2; plVar10 = plVar10 + 1) {
            Json::Value::Value(&paths_1,objectValue);
            TargetId((string *)&paths,*(cmGeneratorTarget **)(*plVar10 + 0x20),&this->TopBuild);
            Json::Value::Value((Value *)&name,(String *)&paths);
            pVVar8 = Json::Value::operator[](&paths_1,"id");
            Json::Value::operator=(pVVar8,(Value *)&name);
            Json::Value::~Value((Value *)&name);
            std::__cxx11::string::~string((string *)&paths);
            pmVar9 = std::__detail::
                     _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this->TargetIndexMap,(key_type *)(*plVar10 + 0x20));
            Json::Value::Value((Value *)&name,*pmVar9);
            pVVar8 = Json::Value::operator[](&paths_1,"index");
            Json::Value::operator=(pVVar8,(Value *)&name);
            Json::Value::~Value((Value *)&name);
            Json::Value::append((Value *)&target_1,&paths_1);
            Json::Value::~Value(&paths_1);
          }
          pVVar8 = Json::Value::operator[](__return_storage_ptr__,"exportTargets");
          Json::Value::operator=(pVVar8,(Value *)&target_1);
          Json::Value::~Value((Value *)&target_1);
          Json::Value::Value(&paths_1,arrayValue);
          cmSystemTools::RelativeIfUnder
                    ((string *)&target_1,&this->TopBuild,(string *)(lVar6 + 0x180));
          Json::Value::Value((Value *)&name,(String *)&target_1);
          Json::Value::append(&paths_1,(Value *)&name);
          Json::Value::~Value((Value *)&name);
          std::__cxx11::string::~string((string *)&target_1);
          pVVar8 = Json::Value::operator[](__return_storage_ptr__,"paths");
          goto LAB_00321c2f;
        }
        this_01 = (cmInstallScriptGenerator *)
                  __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                                 &cmInstallScriptGenerator::typeinfo,0);
        if (this_01 == (cmInstallScriptGenerator *)0x0) {
          this_02 = (cmInstallImportedRuntimeArtifactsGenerator *)
                    __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                                   &cmInstallImportedRuntimeArtifactsGenerator::typeinfo,0);
          if (this_02 == (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
            this_03 = (cmInstallRuntimeDependencySetGenerator *)
                      __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                                     &cmInstallRuntimeDependencySetGenerator::typeinfo,0);
            if (this_03 != (cmInstallRuntimeDependencySetGenerator *)0x0) {
              Json::Value::Value(&paths_1,"runtimeDependencySet");
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
              Json::Value::operator=(pVVar8,&paths_1);
              Json::Value::~Value(&paths_1);
              cmInstallRuntimeDependencySetGenerator::GetDestination(&name,this_03,this->Config);
              Json::Value::Value(&paths_1,&name);
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"destination");
              Json::Value::operator=(pVVar8,&paths_1);
              Json::Value::~Value(&paths_1);
              std::__cxx11::string::~string((string *)&name);
              paths_1._8_8_ = (this_03->DependencySet->Name)._M_dataplus._M_p;
              paths_1.value_ = (ValueHolder)(this_03->DependencySet->Name)._M_string_length;
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&name,
                         (basic_string_view<char,_std::char_traits<char>_> *)&paths_1,
                         (allocator<char> *)&target_1);
              if (name._M_string_length != 0) {
                Json::Value::Value(&paths_1,&name);
                pVVar8 = Json::Value::operator[](__return_storage_ptr__,"runtimeDependencySetName");
                Json::Value::operator=(pVVar8,&paths_1);
                Json::Value::~Value(&paths_1);
              }
              if (this_03->Type == Library) {
                Json::Value::Value(&paths_1,"library");
                pVVar8 = Json::Value::operator[](__return_storage_ptr__,"runtimeDependencySetType");
LAB_003225d1:
                Json::Value::operator=(pVVar8,&paths_1);
                Json::Value::~Value(&paths_1);
              }
              else if (this_03->Type == Framework) {
                Json::Value::Value(&paths_1,"framework");
                pVVar8 = Json::Value::operator[](__return_storage_ptr__,"runtimeDependencySetType");
                goto LAB_003225d1;
              }
              psVar11 = &name;
              goto LAB_003225f1;
            }
            this_04 = (cmInstallFileSetGenerator *)
                      __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                                     &cmInstallFileSetGenerator::typeinfo,0);
            if (this_04 != (cmInstallFileSetGenerator *)0x0) {
              Json::Value::Value(&paths_1,"fileSet");
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
              Json::Value::operator=(pVVar8,&paths_1);
              Json::Value::~Value(&paths_1);
              cmInstallFileSetGenerator::GetDestination(&name,this_04,this->Config);
              Json::Value::Value(&paths_1,&name);
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"destination");
              Json::Value::operator=(pVVar8,&paths_1);
              Json::Value::~Value(&paths_1);
              std::__cxx11::string::~string((string *)&name);
              local_138 = this_04->FileSet;
              target = this_04->Target;
              cmFileSet::CompileDirectoryEntries(&dirCges,local_138);
              lg = cmGeneratorTarget::GetLocalGenerator(target);
              pcVar4 = local_138;
              lg_00 = (cmLocalGenerator *)this->Config;
              cmFileSet::EvaluateDirectoryEntries
                        (&dirs,local_138,&dirCges,lg,(string *)lg_00,target,
                         (cmGeneratorExpressionDAGChecker *)0x0);
              cmFileSet::CompileFileEntries(&entryCges,pcVar4);
              pcVar4 = local_138;
              paths_1.start_ = (ptrdiff_t)&paths_1.bits_;
              paths_1._8_8_ = (ulong)(uint)paths_1._12_4_ << 0x20;
              paths_1.comments_.ptr_._M_t.
              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl =
                   (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                    )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                      )0x0;
              paths_1.limit_ = paths_1.start_;
              for (; entryCges.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
                     entryCges.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                  entryCges.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       entryCges.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1) {
                lg_00 = cmGeneratorTarget::GetLocalGenerator(target);
                cmFileSet::EvaluateFileEntry
                          (pcVar4,&dirs,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)&paths_1,
                           entryCges.
                           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,lg_00,this->Config,target,
                           (cmGeneratorExpressionDAGChecker *)0x0);
              }
              Json::Value::Value(&paths,arrayValue);
              pcVar7 = (cmInstallDirectoryGenerator *)paths_1.start_;
              while (pcVar7 != (cmInstallDirectoryGenerator *)&paths_1.bits_) {
                std::__cxx11::string::string
                          ((string *)&toDir,
                           (string *)
                           ((pcVar7->super_cmInstallGenerator).super_cmScriptGenerator.
                            RuntimeConfigVariable.field_2._M_local_buf + 8));
                if (toDir._M_string_length != 0) {
                  std::__cxx11::string::push_back((char)&toDir);
                }
                psVar3 = (string *)
                         (pcVar7->super_cmInstallGenerator).super_cmScriptGenerator.
                         ConfigurationName._M_string_length;
                local_140 = pcVar7;
                for (psVar11 = (string *)
                               (pcVar7->super_cmInstallGenerator).super_cmScriptGenerator.
                               ConfigurationName._M_dataplus._M_p; psVar11 != psVar3;
                    psVar11 = psVar11 + 1) {
                  name._M_dataplus._M_p = (pointer)toDir._M_string_length;
                  name._M_string_length = (size_type)toDir._M_dataplus._M_p;
                  cmsys::SystemTools::GetFilenameName((string *)local_88,psVar11);
                  target_1 = (cmGeneratorTarget *)local_88[0]._8_8_;
                  local_1f0 = (char *)local_88[0]._0_8_;
                  cmStrCat<>(&local_50,(cmAlphaNum *)&name,(cmAlphaNum *)&target_1);
                  DumpInstallerPath((Value *)&fromDir,(DirectoryObject *)&this->TopSource,psVar11,
                                    &local_50,(string *)lg_00);
                  Json::Value::append(&paths,(Value *)&fromDir);
                  Json::Value::~Value((Value *)&fromDir);
                  std::__cxx11::string::~string((string *)&local_50);
                  std::__cxx11::string::~string((string *)local_88[0]._M_local_buf);
                }
                std::__cxx11::string::~string((string *)&toDir);
                pcVar7 = (cmInstallDirectoryGenerator *)
                         std::_Rb_tree_increment((_Rb_tree_node_base *)local_140);
              }
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"paths");
              Json::Value::operator=(pVVar8,&paths);
              Json::Value::Value((Value *)&name,&local_138->Name);
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"fileSetName");
              Json::Value::operator=(pVVar8,(Value *)&name);
              Json::Value::~Value((Value *)&name);
              Json::Value::Value((Value *)&name,&local_138->Type);
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"fileSetType");
              Json::Value::operator=(pVVar8,(Value *)&name);
              Json::Value::~Value((Value *)&name);
              Json::Value::Value((Value *)&name,arrayValue);
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"fileSetDirectories");
              Json::Value::operator=(pVVar8,(Value *)&name);
              Json::Value::~Value((Value *)&name);
              for (; dirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
                     dirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                  dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1) {
                pVVar8 = Json::Value::operator[](__return_storage_ptr__,"fileSetDirectories");
                cmSystemTools::RelativeIfUnder
                          ((string *)&target_1,&this->TopSource,
                           dirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                Json::Value::Value((Value *)&name,(string *)&target_1);
                Json::Value::append(pVVar8,(Value *)&name);
                Json::Value::~Value((Value *)&name);
                std::__cxx11::string::~string((string *)&target_1);
              }
              Json::Value::Value((Value *)&name,objectValue);
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
              Json::Value::operator=(pVVar8,(Value *)&name);
              Json::Value::~Value((Value *)&name);
              TargetId((string *)&target_1,target,&this->TopBuild);
              Json::Value::Value((Value *)&name,(String *)&target_1);
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
              pVVar8 = Json::Value::operator[](pVVar8,"id");
              Json::Value::operator=(pVVar8,(Value *)&name);
              Json::Value::~Value((Value *)&name);
              std::__cxx11::string::~string((string *)&target_1);
              pmVar9 = std::__detail::
                       _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this->TargetIndexMap,&target);
              Json::Value::Value((Value *)&name,*pmVar9);
              pVVar8 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
              pVVar8 = Json::Value::operator[](pVVar8,"index");
              Json::Value::operator=(pVVar8,(Value *)&name);
              Json::Value::~Value((Value *)&name);
              if (this_04->Optional == true) {
                Json::Value::Value((Value *)&name,true);
                pVVar8 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
                Json::Value::operator=(pVVar8,(Value *)&name);
                Json::Value::~Value((Value *)&name);
              }
              Json::Value::~Value(&paths);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)&paths_1);
              std::
              vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ::~vector(&entryCges);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&dirs);
              std::
              vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ::~vector(&dirCges);
              goto LAB_0032186b;
            }
            this_05 = (cmInstallCxxModuleBmiGenerator *)
                      __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                                     &cmInstallCxxModuleBmiGenerator::typeinfo,0);
            if (this_05 == (cmInstallCxxModuleBmiGenerator *)0x0) goto LAB_0032186b;
            Json::Value::Value(&paths_1,"cxxModuleBmi");
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
            Json::Value::operator=(pVVar8,&paths_1);
            Json::Value::~Value(&paths_1);
            cmInstallCxxModuleBmiGenerator::GetDestination(&name,this_05,this->Config);
            Json::Value::Value(&paths_1,&name);
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"destination");
            Json::Value::operator=(pVVar8,&paths_1);
            Json::Value::~Value(&paths_1);
            std::__cxx11::string::~string((string *)&name);
            target_1 = this_05->Target;
            Json::Value::Value(&paths_1,objectValue);
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
            Json::Value::operator=(pVVar8,&paths_1);
            Json::Value::~Value(&paths_1);
            TargetId(&name,target_1,&this->TopBuild);
            Json::Value::Value(&paths_1,&name);
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
            pVVar8 = Json::Value::operator[](pVVar8,"id");
            Json::Value::operator=(pVVar8,&paths_1);
            Json::Value::~Value(&paths_1);
            std::__cxx11::string::~string((string *)&name);
            pmVar9 = std::__detail::
                     _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this->TargetIndexMap,&target_1);
            Json::Value::Value(&paths_1,*pmVar9);
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
            pVVar8 = Json::Value::operator[](pVVar8,"index");
            Json::Value::operator=(pVVar8,&paths_1);
            Json::Value::~Value(&paths_1);
            if (this_05->Optional != true) goto LAB_0032186b;
            Json::Value::Value(&paths_1,true);
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
          }
          else {
            Json::Value::Value(&paths_1,"importedRuntimeArtifacts");
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
            Json::Value::operator=(pVVar8,&paths_1);
            Json::Value::~Value(&paths_1);
            cmInstallImportedRuntimeArtifactsGenerator::GetDestination(&name,this_02,this->Config);
            Json::Value::Value(&paths_1,&name);
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"destination");
            Json::Value::operator=(pVVar8,&paths_1);
            Json::Value::~Value(&paths_1);
            std::__cxx11::string::~string((string *)&name);
            if (this_02->Optional != true) goto LAB_0032186b;
            Json::Value::Value(&paths_1,true);
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
          }
LAB_00321c2f:
          Json::Value::operator=(pVVar8,&paths_1);
          Json::Value::~Value(&paths_1);
        }
        else {
          if (this_01->Code == true) {
            Json::Value::Value(&paths_1,"code");
            pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
            goto LAB_00321c2f;
          }
          Json::Value::Value(&paths_1,"script");
          pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
          Json::Value::operator=(pVVar8,&paths_1);
          Json::Value::~Value(&paths_1);
          cmInstallScriptGenerator::GetScript((string *)&target_1,this_01,this->Config);
          cmSystemTools::RelativeIfUnder(&name,&this->TopSource,(string *)&target_1);
          Json::Value::Value(&paths_1,&name);
          pVVar8 = Json::Value::operator[](__return_storage_ptr__,"scriptFile");
          Json::Value::operator=(pVVar8,&paths_1);
          Json::Value::~Value(&paths_1);
          std::__cxx11::string::~string((string *)&name);
          psVar11 = (string *)&target_1;
LAB_003225f1:
          std::__cxx11::string::~string((string *)psVar11);
        }
        goto LAB_0032186b;
      }
      cmInstallDirectoryGenerator::GetDirectories
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fromDir,pcVar7,this->Config);
      if (fromDir._M_dataplus._M_p == (pointer)fromDir._M_string_length) goto LAB_00321b76;
      Json::Value::Value(&paths_1,"directory");
      pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
      Json::Value::operator=(pVVar8,&paths_1);
      Json::Value::~Value(&paths_1);
      cmInstallDirectoryGenerator::GetDestination(&name,pcVar7,this->Config);
      Json::Value::Value(&paths_1,&name);
      pVVar8 = Json::Value::operator[](__return_storage_ptr__,"destination");
      local_140 = pcVar7;
      Json::Value::operator=(pVVar8,&paths_1);
      Json::Value::~Value(&paths_1);
      std::__cxx11::string::~string((string *)&name);
      Json::Value::Value(&paths_1,arrayValue);
      for (filename = fromDir._M_dataplus; filename._M_p != (pointer)fromDir._M_string_length;
          filename._M_p = filename._M_p + 0x20) {
        str._M_str = (((string *)filename._M_p)->_M_dataplus)._M_p;
        str._M_len = ((string *)filename._M_p)->_M_string_length;
        bVar5 = cmHasLiteralSuffix<2ul>(str,(char (*) [2])0x6b4baa);
        if (bVar5) {
          std::__cxx11::string::substr((ulong)&target_1,(ulong)filename._M_p);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&paths,".",(allocator<char> *)&toDir);
          DumpInstallerPath((Value *)&name,(DirectoryObject *)&this->TopSource,(string *)&target_1,
                            (string *)&paths,in_R8);
          Json::Value::append(&paths_1,(Value *)&name);
          Json::Value::~Value((Value *)&name);
          std::__cxx11::string::~string((string *)&paths);
        }
        else {
          cmsys::SystemTools::GetFilenameName((string *)&target_1,(string *)filename._M_p);
          DumpInstallerPath((Value *)&name,(DirectoryObject *)&this->TopSource,
                            (string *)filename._M_p,(string *)&target_1,in_R8);
          Json::Value::append(&paths_1,(Value *)&name);
          Json::Value::~Value((Value *)&name);
        }
        std::__cxx11::string::~string((string *)&target_1);
      }
      pVVar8 = Json::Value::operator[](__return_storage_ptr__,"paths");
      Json::Value::operator=(pVVar8,&paths_1);
      if (local_140->Optional == true) {
        Json::Value::Value((Value *)&name,true);
        pVVar8 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
        Json::Value::operator=(pVVar8,(Value *)&name);
        Json::Value::~Value((Value *)&name);
      }
    }
    else {
      cmInstallFilesGenerator::GetFiles
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fromDir,this_00,this->Config);
      if (fromDir._M_dataplus._M_p == (pointer)fromDir._M_string_length) {
LAB_00321b76:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fromDir);
        return __return_storage_ptr__;
      }
      Json::Value::Value(&paths_1,"file");
      pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
      Json::Value::operator=(pVVar8,&paths_1);
      Json::Value::~Value(&paths_1);
      cmInstallFilesGenerator::GetDestination(&name,this_00,this->Config);
      Json::Value::Value(&paths_1,&name);
      pVVar8 = Json::Value::operator[](__return_storage_ptr__,"destination");
      Json::Value::operator=(pVVar8,&paths_1);
      Json::Value::~Value(&paths_1);
      std::__cxx11::string::~string((string *)&name);
      Json::Value::Value(&paths_1,arrayValue);
      cmInstallFilesGenerator::GetRename((string *)&target_1,this_00,this->Config);
      if ((local_1f0 == (char *)0x0) ||
         (fromDir._M_string_length - (long)fromDir._M_dataplus._M_p != 0x20)) {
        cmInstallFilesGenerator::GetFiles
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&toDir,this_00,this->Config);
        for (; toDir._M_dataplus._M_p != (pointer)toDir._M_string_length;
            toDir._M_dataplus._M_p = toDir._M_dataplus._M_p + 0x20) {
          cmSystemTools::RelativeIfUnder
                    ((string *)&paths,&this->TopSource,(string *)toDir._M_dataplus._M_p);
          Json::Value::Value((Value *)&name,(String *)&paths);
          Json::Value::append(&paths_1,(Value *)&name);
          Json::Value::~Value((Value *)&name);
          std::__cxx11::string::~string((string *)&paths);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&toDir);
      }
      else {
        DumpInstallerPath((Value *)&name,(DirectoryObject *)&this->TopSource,
                          (string *)fromDir._M_dataplus._M_p,(string *)&target_1,in_R8);
        Json::Value::append(&paths_1,(Value *)&name);
        Json::Value::~Value((Value *)&name);
      }
      pVVar8 = Json::Value::operator[](__return_storage_ptr__,"paths");
      Json::Value::operator=(pVVar8,&paths_1);
      if (this_00->Optional == true) {
        Json::Value::Value((Value *)&name,true);
        pVVar8 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
        Json::Value::operator=(pVVar8,(Value *)&name);
        Json::Value::~Value((Value *)&name);
      }
      std::__cxx11::string::~string((string *)&target_1);
    }
    Json::Value::~Value(&paths_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fromDir);
    goto LAB_0032186b;
  }
  cmInstallTargetGenerator::GetFiles
            ((Files *)&paths_1,(cmInstallTargetGenerator *)pcVar7,this->Config);
  if (paths_1.value_.int_ == paths_1._8_8_) {
    cmInstallTargetGenerator::Files::~Files((Files *)&paths_1);
    return __return_storage_ptr__;
  }
  Json::Value::Value((Value *)&name,"target");
  pVVar8 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar8,(Value *)&name);
  Json::Value::~Value((Value *)&name);
  cmInstallTargetGenerator::GetDestination
            ((string *)&target_1,(cmInstallTargetGenerator *)pcVar7,this->Config);
  Json::Value::Value((Value *)&name,(String *)&target_1);
  pVVar8 = Json::Value::operator[](__return_storage_ptr__,"destination");
  Json::Value::operator=(pVVar8,(Value *)&name);
  Json::Value::~Value((Value *)&name);
  std::__cxx11::string::~string((string *)&target_1);
  TargetId((string *)&target_1,(cmGeneratorTarget *)(pcVar7->FilePermissions)._M_dataplus._M_p,
           &this->TopBuild);
  Json::Value::Value((Value *)&name,(String *)&target_1);
  pVVar8 = Json::Value::operator[](__return_storage_ptr__,"targetId");
  Json::Value::operator=(pVVar8,(Value *)&name);
  Json::Value::~Value((Value *)&name);
  std::__cxx11::string::~string((string *)&target_1);
  target_1 = (cmGeneratorTarget *)(pcVar7->FilePermissions)._M_dataplus._M_p;
  pmVar9 = std::__detail::
           _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->TargetIndexMap,&target_1);
  Json::Value::Value((Value *)&name,*pmVar9);
  pVVar8 = Json::Value::operator[](__return_storage_ptr__,"targetIndex");
  Json::Value::operator=(pVVar8,(Value *)&name);
  Json::Value::~Value((Value *)&name);
  std::__cxx11::string::string((string *)&fromDir,local_198);
  if (fromDir._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&fromDir);
  }
  std::__cxx11::string::string((string *)&toDir,local_178);
  if (toDir._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&toDir);
  }
  local_140 = pcVar7;
  Json::Value::Value(&paths,arrayValue);
  lVar6 = 8;
  for (uVar12 = 0; uVar12 < (ulong)(paths_1._8_8_ - (long)paths_1.value_ >> 5); uVar12 = uVar12 + 1)
  {
    name._M_dataplus._M_p = (pointer)fromDir._M_string_length;
    name._M_string_length = (size_type)fromDir._M_dataplus._M_p;
    local_1f0 = *(char **)(paths_1.value_.int_ + -8 + lVar6);
    target_1 = *(cmGeneratorTarget **)(paths_1.value_.string_ + lVar6);
    cmStrCat<>(&local_50,(cmAlphaNum *)&name,(cmAlphaNum *)&target_1);
    name._M_dataplus._M_p = (pointer)toDir._M_string_length;
    name._M_string_length = (size_type)toDir._M_dataplus._M_p;
    local_1f0 = *(char **)(paths_1.start_ + -8 + lVar6);
    target_1 = *(cmGeneratorTarget **)(paths_1.start_ + lVar6);
    cmStrCat<>((string *)local_88,(cmAlphaNum *)&name,(cmAlphaNum *)&target_1);
    DumpInstallerPath((Value *)&name,(DirectoryObject *)&this->TopBuild,&local_50,(string *)local_88
                      ,in_R8);
    Json::Value::append(&paths,(Value *)&name);
    Json::Value::~Value((Value *)&name);
    std::__cxx11::string::~string((string *)local_88[0]._M_local_buf);
    std::__cxx11::string::~string((string *)&local_50);
    lVar6 = lVar6 + 0x20;
  }
  pVVar8 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar8,&paths);
  pcVar7 = local_140;
  if (*(char *)((long)&(local_140->DirPermissions)._M_string_length + 5) == '\x01') {
    Json::Value::Value((Value *)&name,true);
    pVVar8 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
    Json::Value::operator=(pVVar8,(Value *)&name);
    Json::Value::~Value((Value *)&name);
  }
  if (*(char *)((long)&(pcVar7->DirPermissions)._M_string_length + 4) == '\x01') {
    Json::Value::Value((Value *)&name,true);
    pVVar8 = Json::Value::operator[](__return_storage_ptr__,"targetIsImportLibrary");
    Json::Value::operator=(pVVar8,(Value *)&name);
    Json::Value::~Value((Value *)&name);
  }
  if (local_158 == NamelinkModeSkip) {
    Json::Value::Value((Value *)&name,"skip");
    pVVar8 = Json::Value::operator[](__return_storage_ptr__,"targetInstallNamelink");
LAB_00321696:
    Json::Value::operator=(pVVar8,(Value *)&name);
    Json::Value::~Value((Value *)&name);
  }
  else if (local_158 == NamelinkModeOnly) {
    Json::Value::Value((Value *)&name,"only");
    pVVar8 = Json::Value::operator[](__return_storage_ptr__,"targetInstallNamelink");
    goto LAB_00321696;
  }
  Json::Value::~Value(&paths);
  std::__cxx11::string::~string((string *)&toDir);
  std::__cxx11::string::~string((string *)&fromDir);
  cmInstallTargetGenerator::Files::~Files((Files *)&paths_1);
LAB_0032186b:
  Json::Value::Value(&paths_1,&gen->Component);
  pVVar8 = Json::Value::operator[](__return_storage_ptr__,"component");
  Json::Value::operator=(pVVar8,&paths_1);
  Json::Value::~Value(&paths_1);
  if (gen->ExcludeFromAll == true) {
    Json::Value::Value(&paths_1,true);
    pVVar8 = Json::Value::operator[](__return_storage_ptr__,"isExcludeFromAll");
    Json::Value::operator=(pVVar8,&paths_1);
    Json::Value::~Value(&paths_1);
  }
  if (gen->AllComponents == true) {
    Json::Value::Value(&paths_1,true);
    pVVar8 = Json::Value::operator[](__return_storage_ptr__,"isForAllComponents");
    Json::Value::operator=(pVVar8,&paths_1);
    Json::Value::~Value(&paths_1);
  }
  value = BacktraceData::Add(&this->Backtraces,&gen->Backtrace);
  if (value.Index != 0xffffffff) {
    Json::Value::Value(&paths_1,value.Index);
    pVVar8 = Json::Value::operator[](__return_storage_ptr__,"backtrace");
    Json::Value::operator=(pVVar8,&paths_1);
    Json::Value::~Value(&paths_1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value DirectoryObject::DumpInstaller(cmInstallGenerator* gen)
{
  assert(gen);
  Json::Value installer = Json::objectValue;

  // Exclude subdirectory installers and file(GET_RUNTIME_DEPENDENCIES)
  // installers. They are implementation details.
  if (dynamic_cast<cmInstallSubdirectoryGenerator*>(gen) ||
      dynamic_cast<cmInstallGetRuntimeDependenciesGenerator*>(gen)) {
    return installer;
  }

  // Exclude installers not used in this configuration.
  if (!gen->InstallsForConfig(this->Config)) {
    return installer;
  }

  // Add fields specific to each kind of install generator.
  if (auto* installTarget = dynamic_cast<cmInstallTargetGenerator*>(gen)) {
    cmInstallTargetGenerator::Files const& files =
      installTarget->GetFiles(this->Config);
    if (files.From.empty()) {
      return installer;
    }

    installer["type"] = "target";
    installer["destination"] = installTarget->GetDestination(this->Config);
    installer["targetId"] =
      TargetId(installTarget->GetTarget(), this->TopBuild);
    installer["targetIndex"] =
      this->TargetIndexMap[installTarget->GetTarget()];

    std::string fromDir = files.FromDir;
    if (!fromDir.empty()) {
      fromDir.push_back('/');
    }

    std::string toDir = files.ToDir;
    if (!toDir.empty()) {
      toDir.push_back('/');
    }

    Json::Value paths = Json::arrayValue;
    for (size_t i = 0; i < files.From.size(); ++i) {
      std::string const& fromPath = cmStrCat(fromDir, files.From[i]);
      std::string const& toPath = cmStrCat(toDir, files.To[i]);
      paths.append(this->DumpInstallerPath(this->TopBuild, fromPath, toPath));
    }
    installer["paths"] = std::move(paths);

    if (installTarget->GetOptional()) {
      installer["isOptional"] = true;
    }

    if (installTarget->IsImportLibrary()) {
      installer["targetIsImportLibrary"] = true;
    }

    switch (files.NamelinkMode) {
      case cmInstallTargetGenerator::NamelinkModeNone:
        break;
      case cmInstallTargetGenerator::NamelinkModeOnly:
        installer["targetInstallNamelink"] = "only";
        break;
      case cmInstallTargetGenerator::NamelinkModeSkip:
        installer["targetInstallNamelink"] = "skip";
        break;
    }

    // FIXME: Parse FilePermissions to provide structured information.
    // FIXME: Thread EXPORT name through from install() call.
  } else if (auto* installFiles =
               dynamic_cast<cmInstallFilesGenerator*>(gen)) {
    std::vector<std::string> const& files =
      installFiles->GetFiles(this->Config);
    if (files.empty()) {
      return installer;
    }

    installer["type"] = "file";
    installer["destination"] = installFiles->GetDestination(this->Config);
    Json::Value paths = Json::arrayValue;
    std::string const& rename = installFiles->GetRename(this->Config);
    if (!rename.empty() && files.size() == 1) {
      paths.append(this->DumpInstallerPath(this->TopSource, files[0], rename));
    } else {
      for (std::string const& file : installFiles->GetFiles(this->Config)) {
        paths.append(RelativeIfUnder(this->TopSource, file));
      }
    }
    installer["paths"] = std::move(paths);
    if (installFiles->GetOptional()) {
      installer["isOptional"] = true;
    }
    // FIXME: Parse FilePermissions to provide structured information.
  } else if (auto* installDir =
               dynamic_cast<cmInstallDirectoryGenerator*>(gen)) {
    std::vector<std::string> const& dirs =
      installDir->GetDirectories(this->Config);
    if (dirs.empty()) {
      return installer;
    }

    installer["type"] = "directory";
    installer["destination"] = installDir->GetDestination(this->Config);
    Json::Value paths = Json::arrayValue;
    for (std::string const& dir : dirs) {
      if (cmHasLiteralSuffix(dir, "/")) {
        paths.append(this->DumpInstallerPath(
          this->TopSource, dir.substr(0, dir.size() - 1), "."));
      } else {
        paths.append(this->DumpInstallerPath(
          this->TopSource, dir, cmSystemTools::GetFilenameName(dir)));
      }
    }
    installer["paths"] = std::move(paths);
    if (installDir->GetOptional()) {
      installer["isOptional"] = true;
    }
    // FIXME: Parse FilePermissions, DirPermissions, and LiteralArguments.
    // to provide structured information.
  } else if (auto* installExport =
               dynamic_cast<cmInstallExportGenerator*>(gen)) {
    installer["type"] = "export";
    installer["destination"] = installExport->GetDestination();
    cmExportSet* exportSet = installExport->GetExportSet();
    installer["exportName"] = exportSet->GetName();
    installer["exportTargets"] = this->DumpInstallerExportTargets(exportSet);
    Json::Value paths = Json::arrayValue;
    paths.append(
      RelativeIfUnder(this->TopBuild, installExport->GetMainImportFile()));
    installer["paths"] = std::move(paths);
  } else if (auto* installScript =
               dynamic_cast<cmInstallScriptGenerator*>(gen)) {
    if (installScript->IsCode()) {
      installer["type"] = "code";
    } else {
      installer["type"] = "script";
      installer["scriptFile"] = RelativeIfUnder(
        this->TopSource, installScript->GetScript(this->Config));
    }
  } else if (auto* installImportedRuntimeArtifacts =
               dynamic_cast<cmInstallImportedRuntimeArtifactsGenerator*>(
                 gen)) {
    installer["type"] = "importedRuntimeArtifacts";
    installer["destination"] =
      installImportedRuntimeArtifacts->GetDestination(this->Config);
    if (installImportedRuntimeArtifacts->GetOptional()) {
      installer["isOptional"] = true;
    }
  } else if (auto* installRuntimeDependencySet =
               dynamic_cast<cmInstallRuntimeDependencySetGenerator*>(gen)) {
    installer["type"] = "runtimeDependencySet";
    installer["destination"] =
      installRuntimeDependencySet->GetDestination(this->Config);
    std::string name(
      installRuntimeDependencySet->GetRuntimeDependencySet()->GetName());
    if (!name.empty()) {
      installer["runtimeDependencySetName"] = name;
    }
    switch (installRuntimeDependencySet->GetDependencyType()) {
      case cmInstallRuntimeDependencySetGenerator::DependencyType::Framework:
        installer["runtimeDependencySetType"] = "framework";
        break;
      case cmInstallRuntimeDependencySetGenerator::DependencyType::Library:
        installer["runtimeDependencySetType"] = "library";
        break;
    }
  } else if (auto* installFileSet =
               dynamic_cast<cmInstallFileSetGenerator*>(gen)) {
    installer["type"] = "fileSet";
    installer["destination"] = installFileSet->GetDestination(this->Config);

    auto* fileSet = installFileSet->GetFileSet();
    auto* target = installFileSet->GetTarget();

    auto dirCges = fileSet->CompileDirectoryEntries();
    auto dirs = fileSet->EvaluateDirectoryEntries(
      dirCges, target->GetLocalGenerator(), this->Config, target);

    auto entryCges = fileSet->CompileFileEntries();
    std::map<std::string, std::vector<std::string>> entries;
    for (auto const& entryCge : entryCges) {
      fileSet->EvaluateFileEntry(dirs, entries, entryCge,
                                 target->GetLocalGenerator(), this->Config,
                                 target);
    }

    Json::Value files = Json::arrayValue;
    for (auto const& it : entries) {
      auto dir = it.first;
      if (!dir.empty()) {
        dir += '/';
      }
      for (auto const& file : it.second) {
        files.append(this->DumpInstallerPath(
          this->TopSource, file,
          cmStrCat(dir, cmSystemTools::GetFilenameName(file))));
      }
    }
    installer["paths"] = std::move(files);
    installer["fileSetName"] = fileSet->GetName();
    installer["fileSetType"] = fileSet->GetType();
    installer["fileSetDirectories"] = Json::arrayValue;
    for (auto const& dir : dirs) {
      installer["fileSetDirectories"].append(
        RelativeIfUnder(this->TopSource, dir));
    }
    installer["fileSetTarget"] = Json::objectValue;
    installer["fileSetTarget"]["id"] = TargetId(target, this->TopBuild);
    installer["fileSetTarget"]["index"] = this->TargetIndexMap[target];

    if (installFileSet->GetOptional()) {
      installer["isOptional"] = true;
    }
  } else if (auto* cxxModuleBmi =
               dynamic_cast<cmInstallCxxModuleBmiGenerator*>(gen)) {
    installer["type"] = "cxxModuleBmi";
    installer["destination"] = cxxModuleBmi->GetDestination(this->Config);

    auto const* target = cxxModuleBmi->GetTarget();
    installer["cxxModuleBmiTarget"] = Json::objectValue;
    installer["cxxModuleBmiTarget"]["id"] = TargetId(target, this->TopBuild);
    installer["cxxModuleBmiTarget"]["index"] = this->TargetIndexMap[target];

    // FIXME: Parse FilePermissions.
    // FIXME: Parse MessageLevel.
    if (cxxModuleBmi->GetOptional()) {
      installer["isOptional"] = true;
    }
  }

  // Add fields common to all install generators.
  installer["component"] = gen->GetComponent();
  if (gen->GetExcludeFromAll()) {
    installer["isExcludeFromAll"] = true;
  }

  if (gen->GetAllComponentsFlag()) {
    installer["isForAllComponents"] = true;
  }

  this->AddBacktrace(installer, gen->GetBacktrace());

  return installer;
}